

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
          (ShaderImageLoadStoreBase *this,GLuint program,string *name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *name_index_map,GLint size,GLenum type)

{
  bool bVar1;
  const_iterator cVar2;
  ulong uVar3;
  char *format;
  allocator<char> local_75;
  GLenum type_gl;
  GLint size_gl;
  GLsizei length_gl;
  GLchar name_gl [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar3 = (ulong)(uint)size;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&name_index_map->_M_t,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(name_index_map->_M_t)._M_impl.super__Rb_tree_header) {
    __assert_fail("iter != name_index_map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27a,
                  "bool gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::CheckUniform(GLuint, const std::string &, const std::map<std::string, GLuint> &, GLint, GLenum)"
                 );
  }
  glu::CallLogWrapper::glGetActiveUniform
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
             cVar2._M_node[2]._M_color,0x20,&length_gl,&size_gl,&type_gl,name_gl);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name_gl,&local_75);
  bVar1 = std::operator!=(&local_48,name);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    anon_unknown_0::Output("Uniform name is %s should be %s.\n",name_gl,(name->_M_dataplus)._M_p);
  }
  else if (length_gl == (int)name->_M_string_length) {
    if (size_gl == 1) {
      if (type_gl == size) {
        return true;
      }
      format = "Uniform type is %d should be %d (%s).\n";
    }
    else {
      format = "Uniform size is %d should be %d (%s).\n";
      uVar3 = 1;
      type_gl = size_gl;
    }
    anon_unknown_0::Output(format,(ulong)type_gl,uVar3,name_gl);
  }
  else {
    anon_unknown_0::Output
              ("Uniform length is %d should be %d (%s).\n",(ulong)(uint)length_gl,
               name->_M_string_length,name_gl);
  }
  return false;
}

Assistant:

bool CheckUniform(GLuint program, const std::string& name, const std::map<std::string, GLuint>& name_index_map,
					  GLint size, GLenum type)
	{
		std::map<std::string, GLuint>::const_iterator iter = name_index_map.find(name);
		assert(iter != name_index_map.end());

		GLchar  name_gl[32];
		GLsizei length_gl;
		GLint   size_gl;
		GLenum  type_gl;

		glGetActiveUniform(program, iter->second, sizeof(name_gl), &length_gl, &size_gl, &type_gl, name_gl);

		if (std::string(name_gl) != name)
		{
			Output("Uniform name is %s should be %s.\n", name_gl, name.c_str());
			return false;
		}
		if (length_gl != static_cast<GLsizei>(name.length()))
		{
			Output("Uniform length is %d should be %d (%s).\n", length_gl, name.length(), name_gl);
			return false;
		}
		if (size_gl != size)
		{
			Output("Uniform size is %d should be %d (%s).\n", size_gl, size, name_gl);
			return false;
		}
		if (type_gl != type)
		{
			Output("Uniform type is %d should be %d (%s).\n", type_gl, type, name_gl);
			return false;
		}

		return true;
	}